

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

string * __thiscall
pugi::impl::(anonymous_namespace)::as_utf8_impl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,wchar_t *str,size_t length)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  string *psVar21;
  string *extraout_RAX;
  ulong uVar22;
  size_t size;
  ulong uVar23;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar24 [32];
  
  if (str == (wchar_t *)0x0) {
    size = 0;
  }
  else {
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar26._8_4_ = 0xffff;
    auVar26._0_8_ = 0xffff0000ffff;
    auVar26._12_4_ = 0xffff;
    auVar26._16_4_ = 0xffff;
    auVar26._20_4_ = 0xffff;
    auVar26._24_4_ = 0xffff;
    auVar26._28_4_ = 0xffff;
    auVar40._8_4_ = 0x80;
    auVar40._0_8_ = 0x8000000080;
    auVar40._12_4_ = 0x80;
    auVar40._16_4_ = 0x80;
    auVar40._20_4_ = 0x80;
    auVar40._24_4_ = 0x80;
    auVar40._28_4_ = 0x80;
    auVar41._8_4_ = 0x800;
    auVar41._0_8_ = 0x80000000800;
    auVar41._12_4_ = 0x800;
    auVar41._16_4_ = 0x800;
    auVar41._20_4_ = 0x800;
    auVar41._24_4_ = 0x800;
    auVar41._28_4_ = 0x800;
    auVar28 = vpbroadcastq_avx512f(ZEXT816(3));
    auVar42 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = vpbroadcastq_avx512f();
    uVar22 = 0;
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vmovdqa64_avx512f(auVar42);
      auVar42 = vporq_avx512f(auVar30,auVar27);
      uVar20 = vpcmpuq_avx512f(auVar42,auVar29,2);
      auVar24 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(this + uVar22 * 4));
      auVar25._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar24._4_4_;
      auVar25._0_4_ = (uint)((byte)uVar20 & 1) * auVar24._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar24._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar24._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar24._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar24._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar24._24_4_;
      auVar25._28_4_ = (uint)(byte)(uVar20 >> 7) * auVar24._28_4_;
      uVar22 = uVar22 + 8;
      uVar18 = vpcmpud_avx512vl(auVar25,auVar41,1);
      auVar42._8_8_ = 2;
      auVar42._0_8_ = 2;
      auVar42._16_8_ = 2;
      auVar42._24_8_ = 2;
      auVar42._32_8_ = 2;
      auVar42._40_8_ = 2;
      auVar42._48_8_ = 2;
      auVar42._56_8_ = 2;
      auVar42 = vpblendmq_avx512f(auVar28,auVar42);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar4 = (bool)((byte)(uVar18 >> 1) & 1);
      lVar33 = in_ZMM8._8_8_;
      bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
      lVar34 = in_ZMM8._16_8_;
      bVar8 = (bool)((byte)(uVar18 >> 3) & 1);
      lVar35 = in_ZMM8._24_8_;
      bVar10 = (bool)((byte)(uVar18 >> 4) & 1);
      lVar36 = in_ZMM8._32_8_;
      bVar12 = (bool)((byte)(uVar18 >> 5) & 1);
      lVar37 = in_ZMM8._40_8_;
      bVar14 = (bool)((byte)(uVar18 >> 6) & 1);
      lVar38 = in_ZMM8._48_8_;
      lVar39 = in_ZMM8._56_8_;
      uVar19 = vpcmpud_avx512vl(auVar25,auVar40,1);
      uVar23 = vpcmpud_avx512vl(auVar25,auVar26,6);
      uVar23 = uVar20 & uVar23;
      auVar30 = vpbroadcastq_avx512f(ZEXT816(1));
      bVar2 = (bool)((byte)uVar19 & 1);
      bVar5 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar32 = vpbroadcastq_avx512f(ZEXT816(4));
      bVar3 = (bool)((byte)uVar23 & 1);
      in_ZMM8._0_8_ =
           (ulong)bVar3 * auVar32._0_8_ |
           (ulong)!bVar3 *
           ((ulong)bVar2 * auVar30._0_8_ |
           (ulong)!bVar2 * ((ulong)bVar1 * auVar42._0_8_ | (ulong)!bVar1 * in_ZMM8._0_8_));
      bVar1 = (bool)((byte)(uVar23 >> 1) & 1);
      in_ZMM8._8_8_ =
           (ulong)bVar1 * auVar32._8_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar5 * auVar30._8_8_ |
           (ulong)!bVar5 * ((ulong)bVar4 * auVar42._8_8_ | (ulong)!bVar4 * lVar33));
      bVar1 = (bool)((byte)(uVar23 >> 2) & 1);
      in_ZMM8._16_8_ =
           (ulong)bVar1 * auVar32._16_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar7 * auVar30._16_8_ |
           (ulong)!bVar7 * ((ulong)bVar6 * auVar42._16_8_ | (ulong)!bVar6 * lVar34));
      bVar1 = (bool)((byte)(uVar23 >> 3) & 1);
      in_ZMM8._24_8_ =
           (ulong)bVar1 * auVar32._24_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar9 * auVar30._24_8_ |
           (ulong)!bVar9 * ((ulong)bVar8 * auVar42._24_8_ | (ulong)!bVar8 * lVar35));
      bVar1 = (bool)((byte)(uVar23 >> 4) & 1);
      in_ZMM8._32_8_ =
           (ulong)bVar1 * auVar32._32_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar11 * auVar30._32_8_ |
           (ulong)!bVar11 * ((ulong)bVar10 * auVar42._32_8_ | (ulong)!bVar10 * lVar36));
      bVar1 = (bool)((byte)(uVar23 >> 5) & 1);
      in_ZMM8._40_8_ =
           (ulong)bVar1 * auVar32._40_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar13 * auVar30._40_8_ |
           (ulong)!bVar13 * ((ulong)bVar12 * auVar42._40_8_ | (ulong)!bVar12 * lVar37));
      bVar1 = (bool)((byte)(uVar23 >> 6) & 1);
      in_ZMM8._48_8_ =
           (ulong)bVar1 * auVar32._48_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar15 * auVar30._48_8_ |
           (ulong)!bVar15 * ((ulong)bVar14 * auVar42._48_8_ | (ulong)!bVar14 * lVar38));
      in_ZMM8._56_8_ =
           (uVar23 >> 7) * auVar32._56_8_ |
           (ulong)!SUB81(uVar23 >> 7,0) *
           ((uVar19 >> 7) * auVar30._56_8_ |
           (ulong)!SUB81(uVar19 >> 7,0) *
           ((uVar18 >> 7) * auVar42._56_8_ | (ulong)!SUB81(uVar18 >> 7,0) * lVar39));
      auVar42 = vpaddq_avx512f(auVar31,in_ZMM8);
    } while (((long)str + 7U & 0xfffffffffffffff8) != uVar22);
    auVar27 = vmovdqa64_avx512f(auVar42);
    bVar1 = (bool)((byte)uVar20 & 1);
    auVar28._0_8_ = (ulong)bVar1 * auVar27._0_8_ | (ulong)!bVar1 * auVar31._0_8_;
    bVar1 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar28._8_8_ = (ulong)bVar1 * auVar27._8_8_ | (ulong)!bVar1 * auVar31._8_8_;
    bVar1 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar28._16_8_ = (ulong)bVar1 * auVar27._16_8_ | (ulong)!bVar1 * auVar31._16_8_;
    bVar1 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar28._24_8_ = (ulong)bVar1 * auVar27._24_8_ | (ulong)!bVar1 * auVar31._24_8_;
    bVar1 = (bool)((byte)(uVar20 >> 4) & 1);
    auVar28._32_8_ = (ulong)bVar1 * auVar27._32_8_ | (ulong)!bVar1 * auVar31._32_8_;
    bVar1 = (bool)((byte)(uVar20 >> 5) & 1);
    auVar28._40_8_ = (ulong)bVar1 * auVar27._40_8_ | (ulong)!bVar1 * auVar31._40_8_;
    bVar1 = (bool)((byte)(uVar20 >> 6) & 1);
    auVar28._48_8_ = (ulong)bVar1 * auVar27._48_8_ | (ulong)!bVar1 * auVar31._48_8_;
    auVar28._56_8_ = (uVar20 >> 7) * auVar27._56_8_ | (ulong)!SUB81(uVar20 >> 7,0) * auVar31._56_8_;
    auVar26 = vextracti64x4_avx512f(auVar28,1);
    auVar27 = vpaddq_avx512f(auVar28,ZEXT3264(auVar26));
    auVar16 = vpaddq_avx(auVar27._0_16_,auVar27._16_16_);
    auVar17 = vpshufd_avx(auVar16,0xee);
    auVar16 = vpaddq_avx(auVar16,auVar17);
    size = auVar16._0_8_;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar21 = (string *)std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)size);
  if (size == 0) {
    return psVar21;
  }
  anon_unknown_0::as_utf8_end
            ((__return_storage_ptr__->_M_dataplus)._M_p,size,(wchar_t *)this,(size_t)str);
  return extraout_RAX;
}

Assistant:

PUGI__FN std::string as_utf8_impl(const wchar_t* str, size_t length)
	{
		// first pass: get length in utf8 characters
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		std::string result;
		result.resize(size);

		// second pass: convert to utf8
		if (size > 0) as_utf8_end(&result[0], size, str, length);

		return result;
	}